

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistage_vector_quantization.cc
# Opt level: O0

void __thiscall
sptk::MultistageVectorQuantization::MultistageVectorQuantization
          (MultistageVectorQuantization *this,int num_order,int num_stage)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int in_stack_ffffffffffffffec;
  
  *in_RDI = &PTR__MultistageVectorQuantization_0012bc68;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  VectorQuantization::VectorQuantization
            ((VectorQuantization *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  *(undefined1 *)(in_RDI + 8) = 1;
  if (((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) < 1)) ||
     (bVar1 = VectorQuantization::IsValid((VectorQuantization *)(in_RDI + 2)), !bVar1)) {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  return;
}

Assistant:

MultistageVectorQuantization::MultistageVectorQuantization(int num_order,
                                                           int num_stage)
    : num_order_(num_order),
      num_stage_(num_stage),
      vector_quantization_(num_order_),
      is_valid_(true) {
  if (num_order_ < 0 || num_stage_ <= 0 || !vector_quantization_.IsValid()) {
    is_valid_ = false;
    return;
  }
}